

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O1

void __thiscall CMakeScanner::SetInputFile(CMakeScanner *this,string *path)

{
  string *psVar1;
  pointer pcVar2;
  counter_type cVar3;
  FILE *pFVar4;
  runtime_error *this_00;
  string error;
  long *local_60 [2];
  long local_50 [2];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pFVar4 = fopen((path->_M_dataplus)._M_p,"rb");
  this->file = (FILE *)pFVar4;
  if (pFVar4 != (FILE *)0x0) {
    pcVar2 = (path->_M_dataplus)._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar2,pcVar2 + path->_M_string_length);
    psVar1 = &(this->scannerCtx).filepath;
    std::__cxx11::string::_M_assign((string *)psVar1);
    (this->scannerCtx).location.begin.filename = psVar1;
    (this->scannerCtx).location.begin.line = 1;
    (this->scannerCtx).location.begin.column = 1;
    (this->scannerCtx).location.end.filename = (this->scannerCtx).location.begin.filename;
    cVar3 = (this->scannerCtx).location.begin.column;
    (this->scannerCtx).location.end.line = (this->scannerCtx).location.begin.line;
    (this->scannerCtx).location.end.column = cVar3;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    yyset_in(this->file,this->yyscanner);
    return;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Cannot open file ","");
  std::__cxx11::string::_M_append((char *)local_40,(ulong)(path->_M_dataplus)._M_p);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetInputFile(const std::string& path)
    {
        file = fopen(path.c_str(), "rb");
        if(!file)
        {
            std::string error{"Cannot open file "};
            error += path;
            throw std::runtime_error{error};
        }
        scannerCtx.SetInputFile(path);
        yyset_in(file, yyscanner);
    }